

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

bool __thiscall GrcSymbolTableEntry::IsAttachXField(GrcSymbolTableEntry *this)

{
  Symbol pGVar1;
  Symbol pGVar2;
  bool bVar3;
  int iVar4;
  
  pGVar1 = this->m_psymtbl->m_psymParent;
  bVar3 = FitsSymbolType(this,ksymtSlotAttr);
  if ((((pGVar1 != (Symbol)0x0 && bVar3) &&
       (pGVar2 = pGVar1->m_psymtbl->m_psymParent, pGVar2 != (Symbol)0x0)) &&
      (iVar4 = std::__cxx11::string::compare((char *)pGVar2), iVar4 == 0)) &&
     ((iVar4 = std::__cxx11::string::compare((char *)pGVar1), iVar4 == 0 ||
      (iVar4 = std::__cxx11::string::compare((char *)pGVar1), iVar4 == 0)))) {
    iVar4 = std::__cxx11::string::compare((char *)this);
    return iVar4 == 0;
  }
  return false;
}

Assistant:

bool GrcSymbolTableEntry::IsAttachXField()
{
	Assert(FitsSymbolType(ksymtSlotAttr) || FitsSymbolType(ksymtFeature));
	Symbol psymParent = ParentSymbol();
	return (FitsSymbolType(ksymtSlotAttr)
		&& (psymParent && psymParent->ParentSymbol())
		&& (psymParent->ParentSymbol()->m_staFieldName == "attach")
		&& ((psymParent->m_staFieldName == "with") || (psymParent->m_staFieldName == "at"))
		&& m_staFieldName == "x");
}